

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void dummy_Op_DeleteProperty(void)

{
  return;
}

Assistant:

Var JavascriptOperators::OP_DeleteRootProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        // In Edge the root is an External Object which can call Dispose and thus, can have reentrancy.
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteRootProperty);
        AssertMsg(VarIs<RootObjectBase>(instance), "Root must be a global object!");
        RootObjectBase* rootObject = static_cast<RootObjectBase*>(instance);

        return scriptContext->GetLibrary()->CreateBoolean(
            rootObject->DeleteRootProperty(propertyId, propertyOperationFlags));
        JIT_HELPER_END(Op_DeleteRootProperty);
    }